

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

int __thiscall
Centaurus::LookaheadDFA<wchar_t>::add_state(LookaheadDFA<wchar_t> *this,CATNClosure *label)

{
  pointer pLVar1;
  bool bVar2;
  uint i;
  ulong uVar3;
  
  uVar3 = 0;
  while( true ) {
    pLVar1 = (this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
             super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                       super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar1) / 0x50) <= uVar3)
    {
      std::vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>>::
      emplace_back<std::set<Centaurus::CATNClosureElement,std::less<Centaurus::CATNClosureElement>,std::allocator<Centaurus::CATNClosureElement>>const&>
                ((vector<Centaurus::LDFAState<wchar_t>,std::allocator<Centaurus::LDFAState<wchar_t>>>
                  *)&(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states,label);
      return (int)(((long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                          super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_NFABase<Centaurus::LDFAState<wchar_t>_>).m_states.
                         super__Vector_base<Centaurus::LDFAState<wchar_t>,_std::allocator<Centaurus::LDFAState<wchar_t>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x50) + -1;
    }
    bVar2 = std::operator==(&label->_M_t,
                            &pLVar1[uVar3].
                             super_NFABaseState<wchar_t,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                             .m_label._M_t);
    if (bVar2) break;
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return (int)uVar3;
}

Assistant:

int add_state(const CATNClosure& label)
	{
		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			if (label == m_states[i].label())
			{
				return i;
			}
		}
		m_states.emplace_back(label);
		return m_states.size() - 1;
	}